

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

int __thiscall
capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
          (PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *this,EVP_PKEY_CTX *ctx)

{
  StructBuilder builder;
  bool bVar1;
  StructSize size;
  StructBuilder local_b8;
  Schema local_90;
  Fault local_78;
  Fault f;
  Reader local_40;
  Schema local_10;
  StructSchema schema_local;
  
  local_10.raw = (RawBrandedSchema *)ctx;
  Schema::getProto((Reader *)&f,&local_10);
  capnp::schema::Node::Reader::getStruct(&local_40,(Reader *)&f);
  bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x76e,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "\"Cannot form pointer to group type.\"",
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&local_78);
  }
  local_90.raw = local_10.raw;
  size = anon_unknown_70::structSizeFromSchema((StructSchema)local_10.raw);
  PointerBuilder::initStruct(&local_b8,(PointerBuilder *)&stack0x00000008,size);
  builder.capTable = local_b8.capTable;
  builder.segment = local_b8.segment;
  builder.data = local_b8.data;
  builder.pointers = local_b8.pointers;
  builder.dataSize = local_b8.dataSize;
  builder.pointerCount = local_b8.pointerCount;
  builder._38_2_ = local_b8._38_2_;
  DynamicStruct::Builder::Builder((Builder *)this,(StructSchema)local_90.raw,builder);
  return (int)this;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::init(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema,
      builder.initStruct(structSizeFromSchema(schema)));
}